

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O1

int run_test_fs_null_req(void)

{
  long *plVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  uv_loop_t *req;
  uv_loop_t *puVar3;
  code *pcStackY_10;
  
  pcStackY_10 = (code *)0x1573e6;
  iVar2 = uv_fs_open((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,0,0,(uv_fs_cb)0x0);
  if (iVar2 == -0x16) {
    pcStackY_10 = (code *)0x1573fc;
    iVar2 = uv_fs_close((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157701;
    pcStackY_10 = (code *)0x157424;
    iVar2 = uv_fs_read((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,(uv_buf_t *)0x0,0,-1,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157706;
    pcStackY_10 = (code *)0x15744c;
    iVar2 = uv_fs_write((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,(uv_buf_t *)0x0,0,-1,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_0015770b;
    pcStackY_10 = (code *)0x157462;
    iVar2 = uv_fs_unlink((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157710;
    pcStackY_10 = (code *)0x15747b;
    iVar2 = uv_fs_mkdir((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157715;
    pcStackY_10 = (code *)0x157491;
    iVar2 = uv_fs_mkdtemp((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_0015771a;
    pcStackY_10 = (code *)0x1574a7;
    iVar2 = uv_fs_mkstemp((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_0015771f;
    pcStackY_10 = (code *)0x1574bd;
    iVar2 = uv_fs_rmdir((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157724;
    pcStackY_10 = (code *)0x1574d6;
    iVar2 = uv_fs_scandir((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157729;
    pcStackY_10 = (code *)0x1574ef;
    iVar2 = uv_fs_link((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(char *)0x0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_0015772e;
    pcStackY_10 = (code *)0x15750b;
    iVar2 = uv_fs_symlink((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(char *)0x0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157733;
    pcStackY_10 = (code *)0x157521;
    iVar2 = uv_fs_readlink((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157738;
    pcStackY_10 = (code *)0x157537;
    iVar2 = uv_fs_realpath((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_0015773d;
    pcStackY_10 = (code *)0x157553;
    iVar2 = uv_fs_chown((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157742;
    pcStackY_10 = (code *)0x15756f;
    iVar2 = uv_fs_fchown((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157747;
    pcStackY_10 = (code *)0x157585;
    iVar2 = uv_fs_stat((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_0015774c;
    pcStackY_10 = (code *)0x15759b;
    iVar2 = uv_fs_lstat((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157751;
    pcStackY_10 = (code *)0x1575b1;
    iVar2 = uv_fs_fstat((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157756;
    pcStackY_10 = (code *)0x1575ca;
    iVar2 = uv_fs_rename((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(char *)0x0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_0015775b;
    pcStackY_10 = (code *)0x1575e0;
    iVar2 = uv_fs_fsync((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157760;
    pcStackY_10 = (code *)0x1575f6;
    iVar2 = uv_fs_fdatasync((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157765;
    pcStackY_10 = (code *)0x15760f;
    iVar2 = uv_fs_ftruncate((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_0015776a;
    pcStackY_10 = (code *)0x15762b;
    iVar2 = uv_fs_copyfile((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(char *)0x0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_0015776f;
    pcStackY_10 = (code *)0x15764f;
    iVar2 = uv_fs_sendfile((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,0,0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157774;
    pcStackY_10 = (code *)0x157668;
    iVar2 = uv_fs_access((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157779;
    pcStackY_10 = (code *)0x157681;
    iVar2 = uv_fs_chmod((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_0015777e;
    pcStackY_10 = (code *)0x15769a;
    iVar2 = uv_fs_fchmod((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157783;
    pcStackY_10 = (code *)0x1576b6;
    iVar2 = uv_fs_utime((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,0.0,0.0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_00157788;
    pcStackY_10 = (code *)0x1576d2;
    iVar2 = uv_fs_futime((uv_loop_t *)0x0,(uv_fs_t *)0x0,0,0.0,0.0,(uv_fs_cb)0x0);
    if (iVar2 != -0x16) goto LAB_0015778d;
    pcStackY_10 = (code *)0x1576e8;
    iVar2 = uv_fs_statfs((uv_loop_t *)0x0,(uv_fs_t *)0x0,(char *)0x0,(uv_fs_cb)0x0);
    if (iVar2 == -0x16) {
      pcStackY_10 = (code *)0x1576f8;
      uv_fs_req_cleanup((uv_fs_t *)0x0);
      return 0;
    }
  }
  else {
    pcStackY_10 = (code *)0x157701;
    run_test_fs_null_req_cold_1();
LAB_00157701:
    pcStackY_10 = (code *)0x157706;
    run_test_fs_null_req_cold_2();
LAB_00157706:
    pcStackY_10 = (code *)0x15770b;
    run_test_fs_null_req_cold_3();
LAB_0015770b:
    pcStackY_10 = (code *)0x157710;
    run_test_fs_null_req_cold_4();
LAB_00157710:
    pcStackY_10 = (code *)0x157715;
    run_test_fs_null_req_cold_5();
LAB_00157715:
    pcStackY_10 = (code *)0x15771a;
    run_test_fs_null_req_cold_6();
LAB_0015771a:
    pcStackY_10 = (code *)0x15771f;
    run_test_fs_null_req_cold_7();
LAB_0015771f:
    pcStackY_10 = (code *)0x157724;
    run_test_fs_null_req_cold_8();
LAB_00157724:
    pcStackY_10 = (code *)0x157729;
    run_test_fs_null_req_cold_9();
LAB_00157729:
    pcStackY_10 = (code *)0x15772e;
    run_test_fs_null_req_cold_10();
LAB_0015772e:
    pcStackY_10 = (code *)0x157733;
    run_test_fs_null_req_cold_11();
LAB_00157733:
    pcStackY_10 = (code *)0x157738;
    run_test_fs_null_req_cold_12();
LAB_00157738:
    pcStackY_10 = (code *)0x15773d;
    run_test_fs_null_req_cold_13();
LAB_0015773d:
    pcStackY_10 = (code *)0x157742;
    run_test_fs_null_req_cold_14();
LAB_00157742:
    pcStackY_10 = (code *)0x157747;
    run_test_fs_null_req_cold_15();
LAB_00157747:
    pcStackY_10 = (code *)0x15774c;
    run_test_fs_null_req_cold_16();
LAB_0015774c:
    pcStackY_10 = (code *)0x157751;
    run_test_fs_null_req_cold_17();
LAB_00157751:
    pcStackY_10 = (code *)0x157756;
    run_test_fs_null_req_cold_18();
LAB_00157756:
    pcStackY_10 = (code *)0x15775b;
    run_test_fs_null_req_cold_19();
LAB_0015775b:
    pcStackY_10 = (code *)0x157760;
    run_test_fs_null_req_cold_20();
LAB_00157760:
    pcStackY_10 = (code *)0x157765;
    run_test_fs_null_req_cold_21();
LAB_00157765:
    pcStackY_10 = (code *)0x15776a;
    run_test_fs_null_req_cold_22();
LAB_0015776a:
    pcStackY_10 = (code *)0x15776f;
    run_test_fs_null_req_cold_23();
LAB_0015776f:
    pcStackY_10 = (code *)0x157774;
    run_test_fs_null_req_cold_24();
LAB_00157774:
    pcStackY_10 = (code *)0x157779;
    run_test_fs_null_req_cold_25();
LAB_00157779:
    pcStackY_10 = (code *)0x15777e;
    run_test_fs_null_req_cold_26();
LAB_0015777e:
    pcStackY_10 = (code *)0x157783;
    run_test_fs_null_req_cold_27();
LAB_00157783:
    pcStackY_10 = (code *)0x157788;
    run_test_fs_null_req_cold_28();
LAB_00157788:
    pcStackY_10 = (code *)0x15778d;
    run_test_fs_null_req_cold_29();
LAB_0015778d:
    pcStackY_10 = (code *)0x157792;
    run_test_fs_null_req_cold_30();
  }
  pcStackY_10 = run_test_fs_statfs;
  run_test_fs_null_req_cold_31();
  puVar3 = (uv_loop_t *)&stack0xfffffffffffffe40;
  loop = uv_default_loop();
  req = (uv_loop_t *)0x0;
  iVar2 = uv_fs_statfs((uv_loop_t *)0x0,(uv_fs_t *)&stack0xfffffffffffffe40,".",(uv_fs_cb)0x0);
  if (iVar2 == 0) {
    statfs_cb((uv_fs_t *)&stack0xfffffffffffffe40);
    req = puVar3;
    if (statfs_cb_count != 1) goto LAB_00157819;
    req = loop;
    iVar2 = uv_fs_statfs(loop,(uv_fs_t *)&stack0xfffffffffffffe40,".",statfs_cb);
    if (iVar2 != 0) goto LAB_0015781e;
    req = loop;
    uv_run(loop,UV_RUN_DEFAULT);
    if (statfs_cb_count == 2) {
      return 0;
    }
  }
  else {
    run_test_fs_statfs_cold_1();
LAB_00157819:
    run_test_fs_statfs_cold_2();
LAB_0015781e:
    run_test_fs_statfs_cold_3();
  }
  run_test_fs_statfs_cold_4();
  if (req->backend_fd == 0x22) {
    puVar3 = req;
    if (req->watcher_queue[0] != (void *)0x0) goto LAB_0015788d;
    plVar1 = (long *)req->watcher_queue[1];
    if (plVar1 == (long *)0x0) goto LAB_00157892;
    if (*plVar1 == 0) goto LAB_00157897;
    if (plVar1[1] == 0) goto LAB_0015789c;
    if (plVar1[2] == 0) goto LAB_001578a1;
    if ((ulong)plVar1[2] < (ulong)plVar1[3]) goto LAB_001578a6;
    if ((ulong)plVar1[3] < (ulong)plVar1[4]) goto LAB_001578ab;
    if ((ulong)plVar1[6] <= (ulong)plVar1[5]) {
      uv_fs_req_cleanup((uv_fs_t *)req);
      if (req->watcher_queue[1] == (void *)0x0) {
        statfs_cb_count = statfs_cb_count + 1;
        return extraout_EAX;
      }
      goto LAB_001578b5;
    }
  }
  else {
    statfs_cb_cold_1();
    puVar3 = req;
LAB_0015788d:
    statfs_cb_cold_2();
LAB_00157892:
    statfs_cb_cold_10();
LAB_00157897:
    statfs_cb_cold_9();
LAB_0015789c:
    statfs_cb_cold_8();
LAB_001578a1:
    statfs_cb_cold_7();
LAB_001578a6:
    statfs_cb_cold_6();
LAB_001578ab:
    statfs_cb_cold_5();
  }
  statfs_cb_cold_4();
LAB_001578b5:
  statfs_cb_cold_3();
  iVar2 = uv_is_closing((uv_handle_t *)puVar3);
  if (iVar2 != 0) {
    return iVar2;
  }
  uv_close((uv_handle_t *)puVar3,(uv_close_cb)0x0);
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(fs_null_req) {
  /* Verify that all fs functions return UV_EINVAL when the request is NULL. */
  int r;

  r = uv_fs_open(NULL, NULL, NULL, 0, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_close(NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_read(NULL, NULL, 0, NULL, 0, -1, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_write(NULL, NULL, 0, NULL, 0, -1, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_unlink(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_mkdir(NULL, NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_mkdtemp(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_mkstemp(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_rmdir(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_scandir(NULL, NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_link(NULL, NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_symlink(NULL, NULL, NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_readlink(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_realpath(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_chown(NULL, NULL, NULL, 0, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_fchown(NULL, NULL, 0, 0, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_stat(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_lstat(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_fstat(NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_rename(NULL, NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_fsync(NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_fdatasync(NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_ftruncate(NULL, NULL, 0, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_copyfile(NULL, NULL, NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_sendfile(NULL, NULL, 0, 0, 0, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_access(NULL, NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_chmod(NULL, NULL, NULL, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_fchmod(NULL, NULL, 0, 0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_utime(NULL, NULL, NULL, 0.0, 0.0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_futime(NULL, NULL, 0, 0.0, 0.0, NULL);
  ASSERT(r == UV_EINVAL);

  r = uv_fs_statfs(NULL, NULL, NULL, NULL);
  ASSERT(r == UV_EINVAL);

  /* This should be a no-op. */
  uv_fs_req_cleanup(NULL);

  return 0;
}